

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

bool __thiscall cmCTestGIT::UpdateImpl(cmCTestGIT *this)

{
  cmCTest *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  string_view val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_488;
  string local_410;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3ec;
  undefined1 local_3eb;
  allocator<char> local_3ea;
  allocator<char> local_3e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  string local_3c0 [32];
  string local_3a0 [32];
  iterator local_380;
  size_type local_378;
  undefined1 local_370 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_334;
  undefined1 local_333;
  allocator<char> local_332;
  allocator<char> local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  string local_308 [32];
  string local_2e8 [32];
  iterator local_2c8;
  size_type local_2c0;
  undefined1 local_2b8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule_sync;
  string local_298;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_274;
  undefined1 local_273;
  allocator<char> local_272;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string local_248 [32];
  string local_228 [32];
  iterator local_208;
  size_type local_200;
  undefined1 local_1f8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  git_submodule_init;
  allocator<char> local_1c9;
  string local_1c8;
  undefined1 local_1a8 [8];
  string init_submodules;
  undefined1 local_180 [7];
  bool ret;
  OutputLogger submodule_err;
  OutputLogger submodule_out;
  undefined1 local_d8 [7];
  bool support_sync_recursive;
  byte local_b2;
  allocator<char> local_b1;
  undefined1 local_b0 [6];
  bool support_recursive;
  string sync_recursive;
  undefined1 local_88 [8];
  string recursive;
  string local_58 [8];
  string git;
  string top_dir;
  cmCTestGIT *this_local;
  
  bVar1 = UpdateInternal(this);
  if (!bVar1) {
    this_local._7_1_ = 0;
    goto LAB_002bc31d;
  }
  FindTopDir_abi_cxx11_((string *)((long)&git.field_2 + 8),this);
  std::__cxx11::string::string
            (local_58,(string *)&(this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_88,"--recursive",
             (allocator<char> *)(sync_recursive.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(sync_recursive.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_b0,"--recursive",&local_b1);
  std::allocator<char>::~allocator(&local_b1);
  local_b2 = 1;
  uVar3 = GetGitVersion(this);
  uVar4 = cmCTestGITVersion(1,6,5,0);
  if (uVar3 < uVar4) {
    local_b2 = 0;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&git.field_2 + 8),"/.gitmodules");
    bVar1 = cmsys::SystemTools::FileExists((string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    if (bVar1) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.6.5 cannot update submodules recursively\n");
    }
  }
  bVar1 = true;
  uVar3 = GetGitVersion(this);
  uVar4 = cmCTestGITVersion(1,8,1,0);
  if (uVar3 < uVar4) {
    bVar1 = false;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &submodule_out.super_LineParser.Separator,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&git.field_2 + 8),"/.gitmodules");
    bVar2 = cmsys::SystemTools::FileExists((string *)&submodule_out.super_LineParser.Separator);
    std::__cxx11::string::~string((string *)&submodule_out.super_LineParser.Separator);
    if (bVar2) {
      std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                      "Git < 1.8.1 cannot synchronize submodules recursively\n");
    }
  }
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)&submodule_err.super_LineParser.Separator,
             (this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"submodule-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_180,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "submodule-err> ");
  this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"GITInitSubmodules",&local_1c9);
  cmCTest::GetCTestConfiguration((string *)local_1a8,this_00,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  val = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1a8);
  git_submodule_init.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)val._M_len;
  bVar2 = cmIsOn(val);
  if (bVar2) {
    local_273 = 1;
    local_270 = &local_268;
    std::__cxx11::string::string((string *)local_270,local_58);
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_248,"submodule",&local_271);
    local_270 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_228,"init",&local_272);
    local_273 = 0;
    local_208 = &local_268;
    local_200 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_274);
    __l_01._M_len = local_200;
    __l_01._M_array = local_208;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_1f8,__l_01,&local_274);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_274);
    local_488 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
    do {
      local_488 = local_488 + -1;
      std::__cxx11::string::~string((string *)local_488);
    } while (local_488 != &local_268);
    std::allocator<char>::~allocator(&local_272);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::string((string *)&local_298,(string *)(git.field_2._M_local_buf + 8));
    init_submodules.field_2._M_local_buf[0xf] =
         cmCTestVC::RunChild((cmCTestVC *)this,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_1f8,(OutputParser *)&submodule_err.super_LineParser.Separator,
                             (OutputParser *)local_180,&local_298,Auto);
    std::__cxx11::string::~string((string *)&local_298);
    git_submodule_sync.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ =
         (init_submodules.field_2._M_local_buf[0xf] & 1U) == 0;
    if (git_submodule_sync.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_) {
      this_local._7_1_ = 0;
    }
    git_submodule_sync.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1f8);
    if (git_submodule_sync.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) goto LAB_002bbbde;
  }
  else {
LAB_002bbbde:
    local_333 = 1;
    local_330 = &local_328;
    std::__cxx11::string::string((string *)local_330,local_58);
    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_308;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_308,"submodule",&local_331);
    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_2e8,"sync",&local_332);
    local_333 = 0;
    local_2c8 = &local_328;
    local_2c0 = 3;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_334);
    __l_00._M_len = local_2c0;
    __l_00._M_array = local_2c8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2b8,__l_00,&local_334);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_334);
    local_4f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2c8;
    do {
      local_4f8 = local_4f8 + -1;
      std::__cxx11::string::~string((string *)local_4f8);
    } while (local_4f8 != &local_328);
    std::allocator<char>::~allocator(&local_332);
    std::allocator<char>::~allocator(&local_331);
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2b8,(value_type *)local_b0);
    }
    std::__cxx11::string::string
              ((string *)
               &git_submodule.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (string *)(git.field_2._M_local_buf + 8));
    init_submodules.field_2._M_local_buf[0xf] =
         cmCTestVC::RunChild((cmCTestVC *)this,
                             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_2b8,(OutputParser *)&submodule_err.super_LineParser.Separator,
                             (OutputParser *)local_180,
                             (string *)
                             &git_submodule.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,Auto);
    std::__cxx11::string::~string
              ((string *)
               &git_submodule.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if ((init_submodules.field_2._M_local_buf[0xf] & 1U) == 0) {
      this_local._7_1_ = false;
      git_submodule_sync.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      local_3eb = 1;
      local_3e8 = &local_3e0;
      std::__cxx11::string::string((string *)local_3e8,local_58);
      local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3c0,"submodule",&local_3e9);
      local_3e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_3a0,"update",&local_3ea);
      local_3eb = 0;
      local_380 = &local_3e0;
      local_378 = 3;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_3ec);
      __l._M_len = local_378;
      __l._M_array = local_380;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_370,__l,&local_3ec);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_3ec);
      local_568 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_380;
      do {
        local_568 = local_568 + -1;
        std::__cxx11::string::~string((string *)local_568);
      } while (local_568 != &local_3e0);
      std::allocator<char>::~allocator(&local_3ea);
      std::allocator<char>::~allocator(&local_3e9);
      if ((local_b2 & 1) != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_370,(value_type *)local_88);
      }
      std::__cxx11::string::string((string *)&local_410,(string *)(git.field_2._M_local_buf + 8));
      this_local._7_1_ =
           cmCTestVC::RunChild((cmCTestVC *)this,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_370,
                               (OutputParser *)&submodule_err.super_LineParser.Separator,
                               (OutputParser *)local_180,&local_410,Auto);
      std::__cxx11::string::~string((string *)&local_410);
      git_submodule_sync.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_370);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_2b8);
  }
  std::__cxx11::string::~string((string *)local_1a8);
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_180);
  cmProcessTools::OutputLogger::~OutputLogger
            ((OutputLogger *)&submodule_err.super_LineParser.Separator);
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(git.field_2._M_local_buf + 8));
LAB_002bc31d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestGIT::UpdateImpl()
{
  if (!this->UpdateInternal()) {
    return false;
  }

  std::string top_dir = this->FindTopDir();
  std::string git = this->CommandLineTool;
  std::string recursive = "--recursive";
  std::string sync_recursive = "--recursive";

  // Git < 1.6.5 did not support submodule --recursive
  bool support_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 6, 5, 0)) {
    support_recursive = false;
    // No need to require >= 1.6.5 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.6.5 cannot update submodules recursively\n";
    }
  }

  // Git < 1.8.1 did not support sync --recursive
  bool support_sync_recursive = true;
  if (this->GetGitVersion() < cmCTestGITVersion(1, 8, 1, 0)) {
    support_sync_recursive = false;
    // No need to require >= 1.8.1 if there are no submodules.
    if (cmSystemTools::FileExists(top_dir + "/.gitmodules")) {
      this->Log << "Git < 1.8.1 cannot synchronize submodules recursively\n";
    }
  }

  OutputLogger submodule_out(this->Log, "submodule-out> ");
  OutputLogger submodule_err(this->Log, "submodule-err> ");

  bool ret;

  std::string init_submodules =
    this->CTest->GetCTestConfiguration("GITInitSubmodules");
  if (cmIsOn(init_submodules)) {
    std::vector<std::string> git_submodule_init = { git, "submodule", "init" };
    ret = this->RunChild(git_submodule_init, &submodule_out, &submodule_err,
                         top_dir);

    if (!ret) {
      return false;
    }
  }

  std::vector<std::string> git_submodule_sync = { git, "submodule", "sync" };
  if (support_sync_recursive) {
    git_submodule_sync.push_back(sync_recursive);
  }
  ret = this->RunChild(git_submodule_sync, &submodule_out, &submodule_err,
                       top_dir);

  if (!ret) {
    return false;
  }

  std::vector<std::string> git_submodule = { git, "submodule", "update" };
  if (support_recursive) {
    git_submodule.push_back(recursive);
  }
  return this->RunChild(git_submodule, &submodule_out, &submodule_err,
                        top_dir);
}